

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::MarkConstantAddressSyms(Func *this,BVSparse<Memory::JitArenaAllocator> *bv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppRVar4;
  Iterator local_40;
  
  if (this->topFunc == this) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7e0,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar2) {
LAB_0042aa5b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40.list =
       &(this->constantAddressRegOpnd).
        super_SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>;
  local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  do {
    if ((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0042aa5b;
      *puVar3 = 0;
    }
    local_40.current =
         (((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)
          &((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current)->
           super_SListNodeBase<Memory::ArenaAllocator>)->super_SListNodeBase<Memory::ArenaAllocator>
         ).next;
    if ((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        local_40.list) {
      return;
    }
    ppRVar4 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40)
    ;
    BVSparse<Memory::JitArenaAllocator>::Set(bv,((*ppRVar4)->m_sym->super_Sym).m_id);
  } while( true );
}

Assistant:

void Func::MarkConstantAddressSyms(BVSparse<JitArenaAllocator> * bv)
{
    Assert(this->GetTopFunc() == this);
    this->constantAddressRegOpnd.Iterate([bv](IR::RegOpnd * regOpnd)
    {
        bv->Set(regOpnd->m_sym->m_id);
    });
}